

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall
ImVector<ImGuiSettingsHandler>::push_front(ImVector<ImGuiSettingsHandler> *this,value_type *v)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  _func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *p_Var4;
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *p_Var5;
  void *pvVar6;
  ImGuiID IVar7;
  undefined4 uVar8;
  ImGuiSettingsHandler *pIVar9;
  uint uVar10;
  uint uVar11;
  
  iVar1 = this->Size;
  if (iVar1 == 0) {
    if (this->Capacity == 0) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      pIVar9 = (ImGuiSettingsHandler *)(*GImAllocatorAllocFunc)(0x180,GImAllocatorUserData);
      if (this->Data != (ImGuiSettingsHandler *)0x0) {
        memcpy(pIVar9,this->Data,(long)this->Size * 0x30);
        if (this->Data != (ImGuiSettingsHandler *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(this->Data,GImAllocatorUserData);
      }
      this->Data = pIVar9;
      this->Capacity = 8;
    }
    pIVar9 = this->Data + this->Size;
  }
  else {
    if (iVar1 < 0) {
      __assert_fail("it >= Data && it <= Data+Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4e6,
                    "iterator ImVector<ImGuiSettingsHandler>::insert(const_iterator, const value_type &) [T = ImGuiSettingsHandler]"
                   );
    }
    iVar2 = this->Capacity;
    if (iVar1 == iVar2) {
      if (iVar2 == 0) {
        uVar10 = 8;
      }
      else {
        uVar10 = iVar2 / 2 + iVar2;
      }
      uVar11 = iVar1 + 1U;
      if ((int)(iVar1 + 1U) < (int)uVar10) {
        uVar11 = uVar10;
      }
      if (iVar2 < (int)uVar11) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
        pIVar9 = (ImGuiSettingsHandler *)
                 (*GImAllocatorAllocFunc)((ulong)uVar11 * 0x30,GImAllocatorUserData);
        if (this->Data != (ImGuiSettingsHandler *)0x0) {
          memcpy(pIVar9,this->Data,(long)this->Size * 0x30);
          if (this->Data != (ImGuiSettingsHandler *)0x0) {
            GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
          }
          (*GImAllocatorFreeFunc)(this->Data,GImAllocatorUserData);
        }
        this->Data = pIVar9;
        this->Capacity = uVar11;
      }
    }
    if (0 < (long)this->Size) {
      memmove(this->Data + 1,this->Data,(long)this->Size * 0x30);
    }
    pIVar9 = this->Data;
  }
  pcVar3 = v->TypeName;
  IVar7 = v->TypeHash;
  uVar8 = *(undefined4 *)&v->field_0xc;
  p_Var4 = v->ReadOpenFn;
  p_Var5 = v->ReadLineFn;
  pvVar6 = v->UserData;
  pIVar9->WriteAllFn = v->WriteAllFn;
  pIVar9->UserData = pvVar6;
  pIVar9->ReadOpenFn = p_Var4;
  pIVar9->ReadLineFn = p_Var5;
  pIVar9->TypeName = pcVar3;
  pIVar9->TypeHash = IVar7;
  *(undefined4 *)&pIVar9->field_0xc = uVar8;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const value_type& v)                 { if (Size == 0) push_back(v); else insert(Data, v); }